

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall cpptempl::data_ptr::operator=(data_ptr *this,string *data)

{
  DataValue *this_00;
  string local_40;
  
  this_00 = (DataValue *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_40,(string *)data);
  DataValue::DataValue(this_00,&local_40);
  std::__shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>::reset<cpptempl::DataValue>
            (&(this->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>,this_00);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

inline void data_ptr::operator = (const std::string& data) {
        ptr.reset(new DataValue(data));
    }